

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::SwapChainVkImpl::InitBuffersAndViews(SwapChainVkImpl *this)

{
  TEXTURE_FORMAT TVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  VkDevice pVVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  IRenderDevice *pIVar5;
  undefined1 auVar8 [8];
  RefCntAutoPtr<Diligent::TextureVkImpl> *pRVar9;
  VkResult VVar10;
  uint uVar11;
  RenderDeviceVkImpl *pRVar12;
  undefined8 *puVar13;
  char (*Args_1) [18];
  char (*Args_1_00) [46];
  ulong uVar14;
  uint32_t swapchainImageCount;
  RefCntAutoPtr<Diligent::TextureVkImpl> pBackBufferTex;
  RefCntAutoPtr<Diligent::ITextureView> pRTV;
  TextureViewDesc RTVDesc;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> swapchainImages;
  uint32_t swapchainImageCount_1;
  string name;
  string msg;
  uint local_29c;
  RefCntAutoPtr<Diligent::TextureVkImpl> local_298;
  RefCntAutoPtr<Diligent::ITextureView> local_290;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined2 local_268;
  DoublePtrHelper<Diligent::ITextureView> local_258;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> local_248;
  undefined1 local_230 [12];
  Uint32 UStack_224;
  Uint32 UStack_220;
  anon_union_4_2_715f406a_for_TextureDesc_4 local_21c;
  TEXTURE_FORMAT local_218;
  undefined8 local_214;
  BIND_FLAGS local_20c;
  undefined2 local_208;
  MISC_TEXTURE_FLAGS local_206;
  TEXTURE_FORMAT local_204;
  Float32 local_200 [5];
  Uint8 local_1ec;
  Uint64 local_1e8;
  RefCntAutoPtr<Diligent::IRenderDevice> *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_198;
  undefined1 local_190;
  undefined2 local_18f;
  TEXTURE_FORMAT local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  Float32 local_178;
  Uint8 local_174;
  undefined8 local_170;
  ios_base local_138 [264];
  
  local_1e0 = &(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice;
  pRVar12 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>(local_1e0);
  pVVar4 = ((pRVar12->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_VkDevice;
  local_230._0_8_ = (ulong)(uint)local_230._4_4_ << 0x20;
  Args_1 = (char (*) [18])0x0;
  VVar10 = (*vkGetSwapchainImagesKHR)
                     (pVVar4,this->m_VkSwapChain,(uint32_t *)local_230,(VkImage *)0x0);
  if (VVar10 != VK_SUCCESS) {
    FormatString<char[26],char[18]>
              ((string *)local_1b8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"err == VK_SUCCESS",Args_1);
    DebugAssertionFailed
              ((Char *)local_1b8._0_8_,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x21c);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,
                      CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                               local_1a8._M_allocated_capacity._0_4_) + 1);
    }
  }
  uVar11 = local_230._0_4_;
  if (local_230._0_4_ !=
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount) {
    FormatString<char[35]>((string *)local_1b8,(char (*) [35])"Unexpected swap chain buffer count");
    DebugAssertionFailed
              ((Char *)local_1b8._0_8_,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x21d);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,
                      CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                               local_1a8._M_allocated_capacity._0_4_) + 1);
    }
    uVar11 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount;
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
  ::resize(&this->m_pBackBufferRTV,(ulong)uVar11);
  std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::resize
            (&this->m_SwapChainImagesInitialized,
             (long)(this->m_pBackBufferRTV).
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_pBackBufferRTV).
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,false);
  local_29c = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount;
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector
            (&local_248,(ulong)local_29c,(allocator_type *)local_1b8);
  VVar10 = (*vkGetSwapchainImagesKHR)
                     (pVVar4,this->m_VkSwapChain,&local_29c,
                      local_248.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  if (VVar10 != VK_SUCCESS) {
    local_1b8._0_8_ = VulkanUtilities::VkResultToString(VVar10);
    LogError<true,char[32],char[17],char_const*>
              (false,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x227,(char (*) [32])"Failed to get swap chain images",
               (char (*) [17])"\nVK Error Code: ",(char **)local_1b8);
  }
  Args_1_00 = (char (*) [46])
              ((long)local_248.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_248.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3);
  if (Args_1_00 != (char (*) [46])(ulong)local_29c) {
    FormatString<char[26],char[46]>
              ((string *)local_1b8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"swapchainImageCount == swapchainImages.size()",Args_1_00);
    DebugAssertionFailed
              ((Char *)local_1b8._0_8_,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x228);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,
                      CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                               local_1a8._M_allocated_capacity._0_4_) + 1);
    }
  }
  if (local_29c != 0) {
    uVar14 = 0;
    do {
      local_230._0_8_ = (Char *)0x0;
      local_230._8_4_ = local_230._8_4_ & 0xffffff00;
      UStack_224 = 0;
      UStack_220 = 0;
      local_21c.ArraySize = 1;
      local_218 = TEX_FORMAT_UNKNOWN;
      local_214._0_4_ = 1;
      local_214._4_4_ = 1;
      local_20c = BIND_NONE;
      local_208._0_1_ = USAGE_DEFAULT;
      local_208._1_1_ = CPU_ACCESS_NONE;
      local_206 = MISC_TEXTURE_FLAG_NONE;
      local_204 = TEX_FORMAT_UNKNOWN;
      local_200[0] = 0.0;
      local_200[1] = 0.0;
      local_200[2] = 0.0;
      local_200[3] = 0.0;
      local_200[4] = 1.0;
      local_1ec = '\0';
      local_1e8 = 1;
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"Main back buffer ",0x11);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
      std::__cxx11::stringbuf::str();
      local_230._0_8_ = local_1d8;
      local_230[8] = 4;
      uVar2 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width;
      uVar6 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height;
      local_218 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                  ColorBufferFormat;
      UStack_224 = uVar2;
      UStack_220 = uVar6;
      local_20c = SwapChainUsageFlagsToBindFlags
                            ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                             Usage);
      local_214._0_4_ = 1;
      local_298.m_pObject = (TextureVkImpl *)0x0;
      pRVar12 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>
                          (local_1e0);
      local_288 = (undefined1  [8])local_298.m_pObject;
      uStack_280 = &local_298;
      RenderDeviceVkImpl::CreateTexture
                (pRVar12,(TextureDesc *)local_230,
                 local_248.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14],RESOURCE_STATE_UNDEFINED,
                 (TextureVkImpl **)local_288);
      pRVar9 = uStack_280;
      auVar8 = local_288;
      if ((uStack_280 != (RefCntAutoPtr<Diligent::TextureVkImpl> *)0x0) &&
         ((undefined1  [8])uStack_280->m_pObject != local_288)) {
        RefCntAutoPtr<Diligent::TextureVkImpl>::Release(uStack_280);
        pRVar9->m_pObject = (TextureVkImpl *)auVar8;
      }
      local_288 = (undefined1  [8])0x0;
      local_278._0_4_ = 0;
      local_278._4_4_ = (anon_union_4_2_fd7742d7_for_TextureViewDesc_6)0x0;
      uStack_270._0_4_ = (anon_union_4_2_468fdb0b_for_TextureViewDesc_8)0x0;
      uStack_270._4_1_ = UAV_ACCESS_UNSPECIFIED;
      uStack_270._5_1_ = TEXTURE_VIEW_FLAG_NONE;
      uStack_270._6_1_ = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
      uStack_270._7_1_ = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
      local_268._0_1_ = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
      local_268._1_1_ = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
      uStack_280._0_1_ = TEXTURE_VIEW_RENDER_TARGET;
      uStack_280._1_1_ = RESOURCE_DIM_UNDEFINED;
      uStack_280._2_2_ = TEX_FORMAT_UNKNOWN;
      uStack_280._4_4_ = 0;
      local_290.m_pObject = (ITextureView *)0x0;
      local_258.NewRawPtr = (ITextureView *)0x0;
      local_258.m_pAutoPtr = &local_290;
      TextureBase<Diligent::EngineVkImplTraits>::CreateView
                (&(local_298.m_pObject)->super_TextureBase<Diligent::EngineVkImplTraits>,
                 (TextureViewDesc *)local_288,&local_258.NewRawPtr);
      RefCntAutoPtr<Diligent::ITextureView>::DoublePtrHelper<Diligent::ITextureView>::
      ~DoublePtrHelper(&local_258);
      local_258.NewRawPtr = (ITextureView *)0x0;
      if (local_290.m_pObject != (ITextureView *)0x0) {
        (**((local_290.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject)
                  (local_290.m_pObject,IID_TextureViewVk,&local_258);
      }
      RefCntAutoPtr<Diligent::ITextureViewVk>::operator=
                ((this->m_pBackBufferRTV).
                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar14,
                 (RefCntAutoPtr<Diligent::ITextureViewVk> *)&local_258);
      if (local_258.NewRawPtr != (ITextureView *)0x0) {
        (*((local_258.NewRawPtr)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
      }
      if (local_290.m_pObject != (ITextureView *)0x0) {
        (*((local_290.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
      }
      RefCntAutoPtr<Diligent::TextureVkImpl>::Release(&local_298);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_29c);
  }
  TVar1 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.DepthBufferFormat;
  if (TVar1 != TEX_FORMAT_UNKNOWN) {
    local_1a8._M_allocated_capacity._4_4_ = 1;
    local_1a8._12_4_ = 1;
    local_18f = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_170 = 1;
    local_1b8[8] = 4;
    uVar3 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width;
    uVar7 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height;
    local_198 = 0x4000000001;
    local_190 = 1;
    local_178 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                DefaultDepthValue;
    local_174 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                DefaultStencilValue;
    local_1b8._0_8_ = "Main depth buffer";
    unique0x00004e80 = (RefCntAutoPtr<Diligent::ITexture> *)local_288;
    local_288 = (undefined1  [8])0x0;
    pIVar5 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice.m_pObject;
    local_230._0_8_ = (Char *)0x0;
    local_1b8._12_4_ = uVar3;
    local_1a8._M_allocated_capacity._0_4_ = uVar7;
    local_1a8._8_2_ = TVar1;
    local_18c = TVar1;
    (*(pIVar5->super_IObject)._vptr_IObject[6])(pIVar5,local_1b8,0);
    RefCntAutoPtr<Diligent::ITexture>::DoublePtrHelper<Diligent::ITexture>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::ITexture> *)local_230);
    puVar13 = (undefined8 *)(**(code **)(*(long *)local_288 + 0x48))(local_288,3);
    local_230._0_8_ = (long *)0x0;
    if (puVar13 != (undefined8 *)0x0) {
      (**(code **)*puVar13)(puVar13,IID_TextureViewVk,local_230);
    }
    RefCntAutoPtr<Diligent::ITextureViewVk>::operator=
              (&this->m_pDepthBufferDSV,(RefCntAutoPtr<Diligent::ITextureViewVk> *)local_230);
    if ((long *)local_230._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_230._0_8_ + 0x10))();
    }
    if (local_288 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_288 + 0x10))();
    }
  }
  if (local_248.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
      super__Vector_impl_data._M_start != (VkImage *)0x0) {
    operator_delete(local_248.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SwapChainVkImpl::InitBuffersAndViews()
{
    RenderDeviceVkImpl* pDeviceVkImpl   = m_pRenderDevice.RawPtr<RenderDeviceVkImpl>();
    VkDevice            LogicalVkDevice = pDeviceVkImpl->GetVkDevice();

#ifdef DILIGENT_DEBUG
    {
        uint32_t swapchainImageCount = 0;
        VkResult err                 = vkGetSwapchainImagesKHR(LogicalVkDevice, m_VkSwapChain, &swapchainImageCount, NULL);
        VERIFY_EXPR(err == VK_SUCCESS);
        VERIFY(swapchainImageCount == m_SwapChainDesc.BufferCount, "Unexpected swap chain buffer count");
    }
#endif

    m_pBackBufferRTV.resize(m_SwapChainDesc.BufferCount);
    m_SwapChainImagesInitialized.resize(m_pBackBufferRTV.size(), false);

    uint32_t             swapchainImageCount = m_SwapChainDesc.BufferCount;
    std::vector<VkImage> swapchainImages(swapchainImageCount);
    VkResult             err = vkGetSwapchainImagesKHR(LogicalVkDevice, m_VkSwapChain, &swapchainImageCount, swapchainImages.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to get swap chain images");
    VERIFY_EXPR(swapchainImageCount == swapchainImages.size());

    for (uint32_t i = 0; i < swapchainImageCount; i++)
    {
        TextureDesc       BackBufferDesc;
        std::stringstream name_ss;
        name_ss << "Main back buffer " << i;
        const std::string name   = name_ss.str();
        BackBufferDesc.Name      = name.c_str();
        BackBufferDesc.Type      = RESOURCE_DIM_TEX_2D;
        BackBufferDesc.Width     = m_SwapChainDesc.Width;
        BackBufferDesc.Height    = m_SwapChainDesc.Height;
        BackBufferDesc.Format    = m_SwapChainDesc.ColorBufferFormat;
        BackBufferDesc.BindFlags = SwapChainUsageFlagsToBindFlags(m_SwapChainDesc.Usage);
        BackBufferDesc.MipLevels = 1;

        RefCntAutoPtr<TextureVkImpl> pBackBufferTex;
        m_pRenderDevice.RawPtr<RenderDeviceVkImpl>()->CreateTexture(BackBufferDesc, swapchainImages[i], RESOURCE_STATE_UNDEFINED, &pBackBufferTex);

        TextureViewDesc RTVDesc;
        RTVDesc.ViewType = TEXTURE_VIEW_RENDER_TARGET;
        RefCntAutoPtr<ITextureView> pRTV;
        pBackBufferTex->CreateView(RTVDesc, &pRTV);
        m_pBackBufferRTV[i] = RefCntAutoPtr<ITextureViewVk>(pRTV, IID_TextureViewVk);
    }

    if (m_SwapChainDesc.DepthBufferFormat != TEX_FORMAT_UNKNOWN)
    {
        TextureDesc DepthBufferDesc;
        DepthBufferDesc.Type        = RESOURCE_DIM_TEX_2D;
        DepthBufferDesc.Width       = m_SwapChainDesc.Width;
        DepthBufferDesc.Height      = m_SwapChainDesc.Height;
        DepthBufferDesc.Format      = m_SwapChainDesc.DepthBufferFormat;
        DepthBufferDesc.SampleCount = 1;
        DepthBufferDesc.Usage       = USAGE_DEFAULT;
        DepthBufferDesc.BindFlags   = BIND_DEPTH_STENCIL;

        DepthBufferDesc.ClearValue.Format               = DepthBufferDesc.Format;
        DepthBufferDesc.ClearValue.DepthStencil.Depth   = m_SwapChainDesc.DefaultDepthValue;
        DepthBufferDesc.ClearValue.DepthStencil.Stencil = m_SwapChainDesc.DefaultStencilValue;
        DepthBufferDesc.Name                            = "Main depth buffer";
        RefCntAutoPtr<ITexture> pDepthBufferTex;
        m_pRenderDevice->CreateTexture(DepthBufferDesc, nullptr, static_cast<ITexture**>(&pDepthBufferTex));
        ITextureView* pDSV = pDepthBufferTex->GetDefaultView(TEXTURE_VIEW_DEPTH_STENCIL);
        m_pDepthBufferDSV  = RefCntAutoPtr<ITextureViewVk>(pDSV, IID_TextureViewVk);
    }
}